

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O0

iterator * __thiscall
linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>::end
          (iterator *__return_storage_ptr__,
          IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_> *this
          )

{
  AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_> local_48;
  IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_> *local_18;
  IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_> *this_local;
  
  local_18 = this;
  this_local = (IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>
                *)__return_storage_ptr__;
  AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>::AdapterState
            (&local_48,&this->source);
  iterator::iterator(__return_storage_ptr__,&local_48,false);
  AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>::~AdapterState(&local_48);
  return __return_storage_ptr__;
}

Assistant:

iterator end() { return iterator(source, false); }